

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::XMLDecl
          (AbstractDOMParser *this,XMLCh *version,XMLCh *encoding,XMLCh *standalone,
          XMLCh *actualEncStr)

{
  DOMDocumentImpl *pDVar1;
  bool bVar2;
  
  pDVar1 = this->fDocument;
  bVar2 = XMLString::equals(L"yes",standalone);
  (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x59])(pDVar1,(ulong)bVar2);
  (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x5b])(this->fDocument,version)
  ;
  DOMDocumentImpl::setXmlEncoding(this->fDocument,encoding);
  DOMDocumentImpl::setInputEncoding(this->fDocument,actualEncStr);
  return;
}

Assistant:

void AbstractDOMParser::XMLDecl(const   XMLCh* const version
                                , const XMLCh* const encoding
                                , const XMLCh* const standalone
                                , const XMLCh* const actualEncStr)
{
    fDocument->setXmlStandalone(XMLString::equals(XMLUni::fgYesString, standalone));
    fDocument->setXmlVersion(version);
    fDocument->setXmlEncoding(encoding);
    fDocument->setInputEncoding(actualEncStr);
}